

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsound_ctr.c
# Opt level: O0

void qsoundc_write_rom(void *info,UINT32 offset,UINT32 length,UINT8 *data)

{
  qsound_chip *chip;
  UINT8 *data_local;
  UINT32 length_local;
  UINT32 offset_local;
  void *info_local;
  
  if (offset <= *(uint *)((long)info + 0x10)) {
    data_local._0_4_ = length;
    if (*(uint *)((long)info + 0x10) < offset + length) {
      data_local._0_4_ = *(int *)((long)info + 0x10) - offset;
    }
    memcpy((void *)(*(long *)((long)info + 8) + (ulong)offset),data,(ulong)(UINT32)data_local);
  }
  return;
}

Assistant:

static void qsoundc_write_rom(void* info, UINT32 offset, UINT32 length, const UINT8* data)
{
	struct qsound_chip* chip = (struct qsound_chip*)info;
	
	if (offset > chip->romSize)
		return;
	if (offset + length > chip->romSize)
		length = chip->romSize - offset;
	
	memcpy(chip->romData + offset, data, length);
	
	return;
}